

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O3

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::
update_filter_coefficients
          (LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *this,
          FilterParameters *filter_parameters)

{
  ulong __new_size;
  float fVar1;
  float fVar2;
  float fVar3;
  FIRFilter *__ptr;
  FIRFilter *this_00;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = filter_parameters->input_cycles_per_second;
  fVar2 = filter_parameters->output_cycles_per_second;
  fVar5 = fVar2 * 0.5;
  fVar3 = filter_parameters->high_frequency_cutoff;
  fVar6 = fVar5;
  if (fVar3 <= fVar5) {
    fVar6 = fVar3;
  }
  fVar3 = (float)(~-(uint)(0.0 < fVar3) & (uint)fVar5 | (uint)fVar6 & -(uint)(0.0 < fVar3));
  fVar6 = ceilf((fVar1 + fVar3) / fVar3);
  uVar4 = (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
  __new_size = uVar4 * 2 + 1;
  this->step_rate_ = fVar1 / fVar2;
  this->position_error_ = 0.0;
  this_00 = (FIRFilter *)operator_new(0x18);
  SignalProcessing::FIRFilter::FIRFilter
            (this_00,__new_size & 0xffffffff,filter_parameters->input_cycles_per_second,0.0,fVar3,
             60.0);
  __ptr = (this->filter_)._M_t.
          super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
          .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl;
  (this->filter_)._M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = this_00;
  if (__ptr != (FIRFilter *)0x0) {
    std::default_delete<SignalProcessing::FIRFilter>::operator()
              ((default_delete<SignalProcessing::FIRFilter> *)&this->filter_,__ptr);
  }
  fVar1 = filter_parameters->input_cycles_per_second;
  fVar2 = filter_parameters->output_cycles_per_second;
  if (((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) ||
     (0.0 <= filter_parameters->high_frequency_cutoff)) {
    if ((fVar2 < fVar1) ||
       (((fVar1 == fVar2 && (!NAN(fVar1) && !NAN(fVar2))) &&
        (0.0 <= filter_parameters->high_frequency_cutoff)))) {
      this->conversion_ = ResampleSmaller;
      if ((long)(this->input_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->input_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start >> 1 != __new_size) {
        if (uVar4 * 2 < this->input_buffer_depth_) {
          resample_input_buffer(this,0x10000);
          this->input_buffer_depth_ = this->input_buffer_depth_ % __new_size;
        }
        std::vector<short,_std::allocator<short>_>::resize(&this->input_buffer_,__new_size);
        return;
      }
    }
    else {
      this->conversion_ = ResampleLarger;
    }
  }
  else {
    this->conversion_ = Copy;
  }
  return;
}

Assistant:

void update_filter_coefficients(const FilterParameters &filter_parameters) {
			float high_pass_frequency = filter_parameters.output_cycles_per_second / 2.0f;
			if(filter_parameters.high_frequency_cutoff > 0.0) {
				high_pass_frequency = std::min(filter_parameters.high_frequency_cutoff, high_pass_frequency);
			}

			// Make a guess at a good number of taps.
			std::size_t number_of_taps = std::size_t(
				ceilf((filter_parameters.input_cycles_per_second + high_pass_frequency) / high_pass_frequency)
			);
			number_of_taps = (number_of_taps * 2) | 1;

			step_rate_ = filter_parameters.input_cycles_per_second / filter_parameters.output_cycles_per_second;
			position_error_ = 0.0f;

			filter_ = std::make_unique<SignalProcessing::FIRFilter>(
				unsigned(number_of_taps),
				filter_parameters.input_cycles_per_second,
				0.0,
				high_pass_frequency,
				SignalProcessing::FIRFilter::DefaultAttenuation);

			// Pick the new conversion function.
			if(	filter_parameters.input_cycles_per_second == filter_parameters.output_cycles_per_second &&
				filter_parameters.high_frequency_cutoff < 0.0) {
				// If input and output rates exactly match, and no additional cut-off has been specified,
				// just accumulate results and pass on.
				conversion_ = Conversion::Copy;
			} else if(	filter_parameters.input_cycles_per_second > filter_parameters.output_cycles_per_second ||
				(filter_parameters.input_cycles_per_second == filter_parameters.output_cycles_per_second && filter_parameters.high_frequency_cutoff >= 0.0)) {
				// If the output rate is less than the input rate, or an additional cut-off has been specified, use the filter.
				conversion_ = Conversion::ResampleSmaller;
			} else {
				conversion_ = Conversion::ResampleLarger;
			}

			// Do something sensible with any dangling input, if necessary.
			const int scale = static_cast<ConcreteT *>(this)->get_scale();
			switch(conversion_) {
				// Neither direct copying nor resampling larger currently use any temporary input.
				// Although in the latter case that's just because it's unimplemented. But, regardless,
				// that means nothing to do.
				default: break;

				case Conversion::ResampleSmaller: {
					// Reize the input buffer only if absolutely necessary; if sizing downward
					// such that a sample would otherwise be lost then output it now. Keep anything
					// currently in the input buffer that hasn't yet been processed.
					const size_t required_buffer_size = size_t(number_of_taps) * (is_stereo + 1);
					if(input_buffer_.size() != required_buffer_size) {
						if(input_buffer_depth_ >= required_buffer_size) {
							resample_input_buffer(scale);
							input_buffer_depth_ %= required_buffer_size;
						}
						input_buffer_.resize(required_buffer_size);
					}
				} break;
			}
		}